

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP4Writer::DoPutDeferred
          (BP4Writer *this,Variable<short> *variable,int16_t *data)

{
  int iVar1;
  ScopedTimer __var2191;
  string local_90;
  string local_70;
  string local_50;
  
  if (DoPutDeferred(adios2::core::Variable<short>&,short_const*)::__var191 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutDeferred(adios2::core::Variable<short>&,short_const*)::
                                 __var191);
    if (iVar1 != 0) {
      DoPutDeferred::__var191 = (void *)ps_timer_create_("BP4Writer::Put");
      __cxa_guard_release(&DoPutDeferred(adios2::core::Variable<short>&,short_const*)::__var191);
    }
  }
  __var2191.m_timer = DoPutDeferred::__var191;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Engine","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BP4Writer","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"PutDeferred","");
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_50,&local_70,&local_90,&(variable->super_VariableBase).m_Name,0,iVar1,5,
              this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  PutDeferredCommon<short>(this,variable,data);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2191);
  return;
}

Assistant:

void BP4Writer::InitParameters()
{
    m_BP4Serializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    m_BP4Serializer.ResizeBuffer(m_BP4Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP4::Open to write");
    m_WriteToBB = !(m_BP4Serializer.m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_BP4Serializer.m_Parameters.BurstBufferDrain;
}